

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

char * xm_load_module(xm_context_t *ctx,char *moddata,size_t moddata_length,char *mempool)

{
  byte bVar1;
  byte bVar2;
  undefined1 uVar3;
  char cVar4;
  ushort uVar5;
  uint uVar6;
  long lVar7;
  ushort *puVar8;
  byte *pbVar9;
  char *pcVar10;
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  uint32_t k_2;
  int8_t v_1;
  uint32_t k_1;
  int16_t v;
  uint32_t length;
  xm_sample_t *sample_1;
  uint16_t j_4;
  uint8_t flags_2;
  xm_sample_t *sample;
  uint16_t j_3;
  uint8_t flags_1;
  uint8_t j_2;
  uint8_t j_1;
  uint32_t ins_header_size;
  xm_instrument_t *instr;
  uint16_t i_1;
  xm_pattern_slot_t *slot;
  uint8_t note;
  uint16_t k;
  uint16_t j;
  xm_pattern_t *pat;
  uint16_t packed_patterndata_size;
  uint16_t i;
  uint16_t flags;
  uint32_t header_size;
  xm_module_t *mod;
  size_t offset;
  ushort local_2a8;
  uint in_stack_fffffffffffffd70;
  uint in_stack_fffffffffffffd74;
  uint in_stack_fffffffffffffd78;
  uint in_stack_fffffffffffffd7c;
  uint in_stack_fffffffffffffd80;
  uint in_stack_fffffffffffffd84;
  uint in_stack_fffffffffffffd88;
  uint in_stack_fffffffffffffd8c;
  uint in_stack_fffffffffffffd90;
  uint in_stack_fffffffffffffd94;
  uint local_268;
  uint local_260;
  uint local_258;
  uint local_254;
  uint local_24c;
  uint local_244;
  uint local_23c;
  ushort local_230;
  uint local_220;
  ushort local_1e4;
  ushort local_1d8;
  ushort local_1cc;
  ushort local_1c0;
  ushort local_1ac;
  uint local_1a8;
  uint local_1a0;
  uint local_198;
  uint local_190;
  uint local_164;
  uint local_15c;
  uint local_154;
  uint local_14c;
  ushort local_140;
  ushort local_134;
  ushort local_128;
  ushort local_11c;
  ushort local_f4;
  ushort local_e8;
  ushort local_dc;
  ushort local_d0;
  ushort local_c4;
  uint local_c0;
  uint local_b8;
  uint local_b0;
  uint local_a8;
  uint local_a4;
  char local_9d;
  uint local_9c;
  short local_96;
  ushort local_84;
  ushort local_72;
  byte local_6e;
  byte local_6d;
  uint local_6c;
  ushort local_5a;
  ushort local_4c;
  ushort local_4a;
  ushort local_38;
  ulong local_28;
  char *local_20;
  
  if (in_RDX < 0x3d) {
    local_a8 = 0;
  }
  else {
    local_a8 = (uint)*(byte *)(in_RSI + 0x3c);
  }
  if (in_RDX < 0x3e) {
    local_b0 = 0;
  }
  else {
    local_b0 = (uint)*(byte *)(in_RSI + 0x3d);
  }
  if (in_RDX < 0x3f) {
    local_b8 = 0;
  }
  else {
    local_b8 = (uint)*(byte *)(in_RSI + 0x3e);
  }
  if (in_RDX < 0x40) {
    local_c0 = 0;
  }
  else {
    local_c0 = (uint)*(byte *)(in_RSI + 0x3f);
  }
  if (in_RDX < 0x41) {
    local_c4 = 0;
  }
  else {
    local_c4 = (ushort)*(byte *)(in_RSI + 0x40);
  }
  if (in_RDX < 0x42) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ushort)*(byte *)(in_RSI + 0x41);
  }
  *(ushort *)(in_RDI + 8) = local_c4 | uVar5 << 8;
  if (in_RDX < 0x43) {
    local_d0 = 0;
  }
  else {
    local_d0 = (ushort)*(byte *)(in_RSI + 0x42);
  }
  if (in_RDX < 0x44) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ushort)*(byte *)(in_RSI + 0x43);
  }
  *(ushort *)(in_RDI + 10) = local_d0 | uVar5 << 8;
  if (in_RDX < 0x45) {
    local_dc = 0;
  }
  else {
    local_dc = (ushort)*(byte *)(in_RSI + 0x44);
  }
  if (in_RDX < 0x46) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ushort)*(byte *)(in_RSI + 0x45);
  }
  *(ushort *)(in_RDI + 0xc) = local_dc | uVar5 << 8;
  if (in_RDX < 0x47) {
    local_e8 = 0;
  }
  else {
    local_e8 = (ushort)*(byte *)(in_RSI + 0x46);
  }
  if (in_RDX < 0x48) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ushort)*(byte *)(in_RSI + 0x47);
  }
  *(ushort *)(in_RDI + 0xe) = local_e8 | uVar5 << 8;
  if (in_RDX < 0x49) {
    local_f4 = 0;
  }
  else {
    local_f4 = (ushort)*(byte *)(in_RSI + 0x48);
  }
  if (in_RDX < 0x4a) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ushort)*(byte *)(in_RSI + 0x49);
  }
  *(ushort *)(in_RDI + 0x10) = local_f4 | uVar5 << 8;
  *(long *)(in_RDI + 0x118) = in_RCX;
  lVar7 = (ulong)*(ushort *)(in_RDI + 0xe) * 0x10 + in_RCX;
  *(long *)(in_RDI + 0x120) = lVar7;
  local_20 = (char *)((ulong)*(ushort *)(in_RDI + 0x10) * 0xf8 + lVar7);
  if (in_RDX < 0x4b) {
    bVar1 = 0;
  }
  else {
    bVar1 = *(byte *)(in_RSI + 0x4a);
  }
  *(uint *)(in_RDI + 0x14) = (uint)((bVar1 & 1) == 0);
  if (in_RDX < 0x4d) {
    local_11c = 0;
  }
  else {
    local_11c = (ushort)*(byte *)(in_RSI + 0x4c);
  }
  if (in_RDX < 0x4e) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ushort)*(byte *)(in_RSI + 0x4d);
  }
  *(ushort *)(in_RDI + 300) = local_11c | uVar5 << 8;
  if (in_RDX < 0x4f) {
    local_128 = 0;
  }
  else {
    local_128 = (ushort)*(byte *)(in_RSI + 0x4e);
  }
  if (in_RDX < 0x50) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ushort)*(byte *)(in_RSI + 0x4f);
  }
  *(ushort *)(in_RDI + 0x12e) = local_128 | uVar5 << 8;
  memcpy_pad((void *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             (void *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  local_28 = (ulong)(local_a8 | local_b0 << 8 | (local_b8 | local_c0 << 8) << 0x10) + 0x3c;
  local_268 = in_stack_fffffffffffffd94;
  for (local_38 = 0; local_38 < *(ushort *)(in_RDI + 0xe); local_38 = local_38 + 1) {
    if (local_28 + 7 < in_RDX) {
      local_134 = (ushort)*(byte *)(in_RSI + 7 + local_28);
    }
    else {
      local_134 = 0;
    }
    if (local_28 + 8 < in_RDX) {
      uVar5 = (ushort)*(byte *)(in_RSI + 8 + local_28);
    }
    else {
      uVar5 = 0;
    }
    local_134 = local_134 | uVar5 << 8;
    puVar8 = (ushort *)(*(long *)(in_RDI + 0x118) + (long)(int)(uint)local_38 * 0x10);
    if (local_28 + 5 < in_RDX) {
      local_140 = (ushort)*(byte *)(in_RSI + 5 + local_28);
    }
    else {
      local_140 = 0;
    }
    if (local_28 + 6 < in_RDX) {
      uVar5 = (ushort)*(byte *)(in_RSI + 6 + local_28);
    }
    else {
      uVar5 = 0;
    }
    *puVar8 = local_140 | uVar5 << 8;
    *(char **)(puVar8 + 4) = local_20;
    local_20 = local_20 + (long)(int)((uint)*(ushort *)(in_RDI + 0xc) * (uint)*puVar8) * 5;
    if (local_28 < in_RDX) {
      local_14c = (uint)*(byte *)(in_RSI + local_28);
    }
    else {
      local_14c = 0;
    }
    if (local_28 + 1 < in_RDX) {
      local_154 = (uint)*(byte *)(in_RSI + 1 + local_28);
    }
    else {
      local_154 = 0;
    }
    if (local_28 + 2 < in_RDX) {
      local_15c = (uint)*(byte *)(in_RSI + 2 + local_28);
    }
    else {
      local_15c = 0;
    }
    if (local_28 + 3 < in_RDX) {
      local_164 = (uint)*(byte *)(in_RSI + 3 + local_28);
    }
    else {
      local_164 = 0;
    }
    lVar7 = (local_14c | local_154 << 8 | (local_15c | local_164 << 8) << 0x10) + local_28;
    if (local_134 == 0) {
      memset(*(void **)(puVar8 + 4),0,(ulong)*puVar8 * 5 * (ulong)*(ushort *)(in_RDI + 0xc));
    }
    else {
      local_4a = 0;
      local_4c = 0;
      while (local_4a < local_134) {
        if (lVar7 + (ulong)local_4a < in_RDX) {
          bVar1 = *(byte *)(in_RSI + lVar7 + (ulong)local_4a);
        }
        else {
          bVar1 = 0;
        }
        pbVar9 = (byte *)(*(long *)(puVar8 + 4) + (long)(int)(uint)local_4c * 5);
        if ((bVar1 & 0x80) == 0) {
          *pbVar9 = bVar1;
          if (lVar7 + (ulong)local_4a + 1 < in_RDX) {
            bVar1 = *(byte *)(in_RSI + 1 + lVar7 + (ulong)local_4a);
          }
          else {
            bVar1 = 0;
          }
          pbVar9[1] = bVar1;
          if (lVar7 + (ulong)local_4a + 2 < in_RDX) {
            bVar1 = *(byte *)(in_RSI + 2 + lVar7 + (ulong)local_4a);
          }
          else {
            bVar1 = 0;
          }
          pbVar9[2] = bVar1;
          if (lVar7 + (ulong)local_4a + 3 < in_RDX) {
            bVar1 = *(byte *)(in_RSI + 3 + lVar7 + (ulong)local_4a);
          }
          else {
            bVar1 = 0;
          }
          pbVar9[3] = bVar1;
          if (lVar7 + (ulong)local_4a + 4 < in_RDX) {
            bVar1 = *(byte *)(in_RSI + 4 + lVar7 + (ulong)local_4a);
          }
          else {
            bVar1 = 0;
          }
          pbVar9[4] = bVar1;
          local_4a = local_4a + 5;
        }
        else {
          uVar5 = local_4a + 1;
          if ((bVar1 & 1) == 0) {
            *pbVar9 = 0;
            local_4a = uVar5;
          }
          else {
            if (lVar7 + (ulong)uVar5 < in_RDX) {
              bVar2 = *(byte *)(in_RSI + lVar7 + (ulong)uVar5);
            }
            else {
              bVar2 = 0;
            }
            *pbVar9 = bVar2;
            local_4a = local_4a + 2;
          }
          if ((bVar1 & 2) == 0) {
            pbVar9[1] = 0;
          }
          else {
            if (lVar7 + (ulong)local_4a < in_RDX) {
              bVar2 = *(byte *)(in_RSI + lVar7 + (ulong)local_4a);
            }
            else {
              bVar2 = 0;
            }
            pbVar9[1] = bVar2;
            local_4a = local_4a + 1;
          }
          if ((bVar1 & 4) == 0) {
            pbVar9[2] = 0;
          }
          else {
            if (lVar7 + (ulong)local_4a < in_RDX) {
              bVar2 = *(byte *)(in_RSI + lVar7 + (ulong)local_4a);
            }
            else {
              bVar2 = 0;
            }
            pbVar9[2] = bVar2;
            local_4a = local_4a + 1;
          }
          if ((bVar1 & 8) == 0) {
            pbVar9[3] = 0;
          }
          else {
            if (lVar7 + (ulong)local_4a < in_RDX) {
              bVar2 = *(byte *)(in_RSI + lVar7 + (ulong)local_4a);
            }
            else {
              bVar2 = 0;
            }
            pbVar9[3] = bVar2;
            local_4a = local_4a + 1;
          }
          if ((bVar1 & 0x10) == 0) {
            pbVar9[4] = 0;
          }
          else {
            if (lVar7 + (ulong)local_4a < in_RDX) {
              bVar1 = *(byte *)(in_RSI + lVar7 + (ulong)local_4a);
            }
            else {
              bVar1 = 0;
            }
            pbVar9[4] = bVar1;
            local_4a = local_4a + 1;
          }
        }
        local_4c = local_4c + 1;
      }
    }
    local_28 = (ulong)local_134 + lVar7;
  }
  for (local_5a = 0; local_5a < *(ushort *)(in_RDI + 0x10); local_5a = local_5a + 1) {
    puVar8 = (ushort *)(*(long *)(in_RDI + 0x120) + (long)(int)(uint)local_5a * 0xf8);
    if (local_28 < in_RDX) {
      local_190 = (uint)*(byte *)(in_RSI + local_28);
    }
    else {
      local_190 = 0;
    }
    if (local_28 + 1 < in_RDX) {
      local_198 = (uint)*(byte *)(in_RSI + 1 + local_28);
    }
    else {
      local_198 = 0;
    }
    if (local_28 + 2 < in_RDX) {
      local_1a0 = (uint)*(byte *)(in_RSI + 2 + local_28);
    }
    else {
      local_1a0 = 0;
    }
    if (local_28 + 3 < in_RDX) {
      local_1a8 = (uint)*(byte *)(in_RSI + 3 + local_28);
    }
    else {
      local_1a8 = 0;
    }
    local_6c = local_190 | local_198 << 8 | (local_1a0 | local_1a8 << 8) << 0x10;
    if ((local_6c == 0) || (0x107 < local_6c)) {
      local_6c = 0x107;
    }
    if (local_28 + 0x1b < local_28 + local_6c) {
      local_1ac = (ushort)*(byte *)(in_RSI + 0x1b + local_28);
    }
    else {
      local_1ac = 0;
    }
    if (local_28 + 0x1c < local_28 + local_6c) {
      uVar5 = (ushort)*(byte *)(in_RSI + 0x1c + local_28);
    }
    else {
      uVar5 = 0;
    }
    *puVar8 = local_1ac | uVar5 << 8;
    if (*puVar8 == 0) {
      puVar8[0x78] = 0;
      puVar8[0x79] = 0;
      puVar8[0x7a] = 0;
      puVar8[0x7b] = 0;
    }
    else {
      memcpy_pad((void *)CONCAT44(local_268,in_stack_fffffffffffffd90),
                 CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 (void *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                 CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      if (local_28 + 0xe1 < local_28 + local_6c) {
        uVar3 = *(undefined1 *)(in_RSI + 0xe1 + local_28);
      }
      else {
        uVar3 = 0;
      }
      *(undefined1 *)(puVar8 + 0x49) = uVar3;
      if (0xc < (byte)puVar8[0x49]) {
        *(undefined1 *)(puVar8 + 0x49) = 0xc;
      }
      if (local_28 + 0xe2 < local_28 + local_6c) {
        uVar3 = *(undefined1 *)(in_RSI + 0xe2 + local_28);
      }
      else {
        uVar3 = 0;
      }
      *(undefined1 *)(puVar8 + 0x65) = uVar3;
      if (0xc < (byte)puVar8[0x65]) {
        *(undefined1 *)(puVar8 + 0x65) = 0xc;
      }
      for (local_6d = 0; local_6d < (byte)puVar8[0x49]; local_6d = local_6d + 1) {
        if (local_28 + 0x81 + (long)(int)((uint)local_6d << 2) < local_28 + local_6c) {
          local_1c0 = (ushort)*(byte *)(in_RSI + local_28 + 0x81 + (long)(int)((uint)local_6d << 2))
          ;
        }
        else {
          local_1c0 = 0;
        }
        if (local_28 + (long)(int)((uint)local_6d << 2) + 0x82 < local_28 + local_6c) {
          uVar5 = (ushort)*(byte *)(in_RSI + local_28 + 0x82 + (long)(int)((uint)local_6d << 2));
        }
        else {
          uVar5 = 0;
        }
        puVar8[(ulong)local_6d * 2 + 0x31] = local_1c0 | uVar5 << 8;
        if (local_28 + (long)(int)((uint)local_6d << 2) + 0x83 < local_28 + local_6c) {
          local_1cc = (ushort)*(byte *)(in_RSI + local_28 + 0x83 + (long)(int)((uint)local_6d << 2))
          ;
        }
        else {
          local_1cc = 0;
        }
        if (local_28 + (long)(int)((uint)local_6d << 2) + 0x84 < local_28 + local_6c) {
          uVar5 = (ushort)*(byte *)(in_RSI + local_28 + 0x84 + (long)(int)((uint)local_6d << 2));
        }
        else {
          uVar5 = 0;
        }
        puVar8[(ulong)local_6d * 2 + 0x32] = local_1cc | uVar5 << 8;
      }
      for (local_6e = 0; local_6e < (byte)puVar8[0x65]; local_6e = local_6e + 1) {
        if (local_28 + 0xb1 + (long)(int)((uint)local_6e << 2) < local_28 + local_6c) {
          local_1d8 = (ushort)*(byte *)(in_RSI + local_28 + 0xb1 + (long)(int)((uint)local_6e << 2))
          ;
        }
        else {
          local_1d8 = 0;
        }
        if (local_28 + (long)(int)((uint)local_6e << 2) + 0xb2 < local_28 + local_6c) {
          uVar5 = (ushort)*(byte *)(in_RSI + local_28 + 0xb2 + (long)(int)((uint)local_6e << 2));
        }
        else {
          uVar5 = 0;
        }
        puVar8[(ulong)local_6e * 2 + 0x4d] = local_1d8 | uVar5 << 8;
        if (local_28 + (long)(int)((uint)local_6e << 2) + 0xb3 < local_28 + local_6c) {
          local_1e4 = (ushort)*(byte *)(in_RSI + local_28 + 0xb3 + (long)(int)((uint)local_6e << 2))
          ;
        }
        else {
          local_1e4 = 0;
        }
        if (local_28 + (long)(int)((uint)local_6e << 2) + 0xb4 < local_28 + local_6c) {
          uVar5 = (ushort)*(byte *)(in_RSI + local_28 + 0xb4 + (long)(int)((uint)local_6e << 2));
        }
        else {
          uVar5 = 0;
        }
        puVar8[(ulong)local_6e * 2 + 0x4e] = local_1e4 | uVar5 << 8;
      }
      if (local_28 + 0xe3 < local_28 + local_6c) {
        uVar3 = *(undefined1 *)(in_RSI + 0xe3 + local_28);
      }
      else {
        uVar3 = 0;
      }
      *(undefined1 *)((long)puVar8 + 0x93) = uVar3;
      if (local_28 + 0xe4 < local_28 + local_6c) {
        uVar3 = *(undefined1 *)(in_RSI + 0xe4 + local_28);
      }
      else {
        uVar3 = 0;
      }
      *(undefined1 *)(puVar8 + 0x4a) = uVar3;
      if (local_28 + 0xe5 < local_28 + local_6c) {
        uVar3 = *(undefined1 *)(in_RSI + 0xe5 + local_28);
      }
      else {
        uVar3 = 0;
      }
      *(undefined1 *)((long)puVar8 + 0x95) = uVar3;
      if (local_28 + 0xe6 < local_28 + local_6c) {
        uVar3 = *(undefined1 *)(in_RSI + 0xe6 + local_28);
      }
      else {
        uVar3 = 0;
      }
      *(undefined1 *)((long)puVar8 + 0xcb) = uVar3;
      if (local_28 + 0xe7 < local_28 + local_6c) {
        uVar3 = *(undefined1 *)(in_RSI + 0xe7 + local_28);
      }
      else {
        uVar3 = 0;
      }
      *(undefined1 *)(puVar8 + 0x66) = uVar3;
      if (local_28 + 0xe8 < local_28 + local_6c) {
        uVar3 = *(undefined1 *)(in_RSI + 0xe8 + local_28);
      }
      else {
        uVar3 = 0;
      }
      *(undefined1 *)((long)puVar8 + 0xcd) = uVar3;
      if ((char)puVar8[0x49] != '\0') {
        if ((int)(uint)(byte)puVar8[0x4a] < (int)((byte)puVar8[0x49] - 1)) {
          cVar4 = (char)puVar8[0x4a];
        }
        else {
          cVar4 = (char)puVar8[0x49] + -1;
        }
        *(char *)(puVar8 + 0x4a) = cVar4;
        if ((int)(uint)*(byte *)((long)puVar8 + 0x95) < (int)((byte)puVar8[0x49] - 1)) {
          cVar4 = *(char *)((long)puVar8 + 0x95);
        }
        else {
          cVar4 = (char)puVar8[0x49] + -1;
        }
        *(char *)((long)puVar8 + 0x95) = cVar4;
      }
      if ((char)puVar8[0x65] != '\0') {
        if ((int)(uint)(byte)puVar8[0x66] < (int)((byte)puVar8[0x65] - 1)) {
          cVar4 = (char)puVar8[0x66];
        }
        else {
          cVar4 = (char)puVar8[0x65] + -1;
        }
        *(char *)(puVar8 + 0x66) = cVar4;
        if ((int)(uint)*(byte *)((long)puVar8 + 0xcd) < (int)((byte)puVar8[0x65] - 1)) {
          cVar4 = *(char *)((long)puVar8 + 0xcd);
        }
        else {
          cVar4 = (char)puVar8[0x65] + -1;
        }
        *(char *)((long)puVar8 + 0xcd) = cVar4;
      }
      if (local_28 + 0xe9 < local_28 + local_6c) {
        bVar1 = *(byte *)(in_RSI + 0xe9 + local_28);
      }
      else {
        bVar1 = 0;
      }
      *(bool *)(puVar8 + 0x4b) = (bVar1 & 1) != 0;
      *(bool *)((long)puVar8 + 0x97) = (bVar1 & 2) != 0;
      *(bool *)(puVar8 + 0x4c) = (bVar1 & 4) != 0;
      if (local_28 + 0xea < local_28 + local_6c) {
        bVar1 = *(byte *)(in_RSI + 0xea + local_28);
      }
      else {
        bVar1 = 0;
      }
      *(bool *)(puVar8 + 0x67) = (bVar1 & 1) != 0;
      *(bool *)((long)puVar8 + 0xcf) = (bVar1 & 2) != 0;
      *(bool *)(puVar8 + 0x68) = (bVar1 & 4) != 0;
      if (local_28 + 0xeb < local_28 + local_6c) {
        local_220 = (uint)*(byte *)(in_RSI + 0xeb + local_28);
      }
      else {
        local_220 = 0;
      }
      *(uint *)(puVar8 + 0x6a) = local_220;
      if (*(int *)(puVar8 + 0x6a) == 2) {
        puVar8[0x6a] = 1;
        puVar8[0x6b] = 0;
      }
      else if (*(int *)(puVar8 + 0x6a) == 1) {
        puVar8[0x6a] = 2;
        puVar8[0x6b] = 0;
      }
      if (local_28 + 0xec < local_28 + local_6c) {
        uVar3 = *(undefined1 *)(in_RSI + 0xec + local_28);
      }
      else {
        uVar3 = 0;
      }
      *(undefined1 *)(puVar8 + 0x6c) = uVar3;
      if (local_28 + 0xed < local_28 + local_6c) {
        uVar3 = *(undefined1 *)(in_RSI + 0xed + local_28);
      }
      else {
        uVar3 = 0;
      }
      *(undefined1 *)((long)puVar8 + 0xd9) = uVar3;
      if (local_28 + 0xee < local_28 + local_6c) {
        uVar3 = *(undefined1 *)(in_RSI + 0xee + local_28);
      }
      else {
        uVar3 = 0;
      }
      *(undefined1 *)(puVar8 + 0x6d) = uVar3;
      if (local_28 + 0xef < local_28 + local_6c) {
        local_230 = (ushort)*(byte *)(in_RSI + 0xef + local_28);
      }
      else {
        local_230 = 0;
      }
      if (local_28 + 0xf0 < local_28 + local_6c) {
        uVar5 = (ushort)*(byte *)(in_RSI + 0xf0 + local_28);
      }
      else {
        uVar5 = 0;
      }
      puVar8[0x6e] = local_230 | uVar5 << 8;
      *(char **)(puVar8 + 0x78) = local_20;
      local_20 = local_20 + (ulong)*puVar8 * 0x38;
    }
    local_28 = local_6c + local_28;
    for (local_72 = 0; local_72 < *puVar8; local_72 = local_72 + 1) {
      pcVar10 = (char *)(*(long *)(puVar8 + 0x78) + (long)(int)(uint)local_72 * 0x38);
      if (local_28 < in_RDX) {
        local_23c = (uint)*(byte *)(in_RSI + local_28);
      }
      else {
        local_23c = 0;
      }
      if (local_28 + 1 < in_RDX) {
        local_244 = (uint)*(byte *)(in_RSI + 1 + local_28);
      }
      else {
        local_244 = 0;
      }
      if (local_28 + 2 < in_RDX) {
        local_24c = (uint)*(byte *)(in_RSI + 2 + local_28);
      }
      else {
        local_24c = 0;
      }
      if (local_28 + 3 < in_RDX) {
        local_254 = (uint)*(byte *)(in_RSI + 3 + local_28);
      }
      else {
        local_254 = 0;
      }
      *(uint *)(pcVar10 + 4) = local_23c | local_244 << 8 | (local_24c | local_254 << 8) << 0x10;
      if (local_28 + 4 < in_RDX) {
        local_258 = (uint)*(byte *)(in_RSI + 4 + local_28);
      }
      else {
        local_258 = 0;
      }
      if (local_28 + 5 < in_RDX) {
        local_260 = (uint)*(byte *)(in_RSI + 5 + local_28);
      }
      else {
        local_260 = 0;
      }
      if (local_28 + 6 < in_RDX) {
        local_268 = (uint)*(byte *)(in_RSI + 6 + local_28);
      }
      else {
        local_268 = 0;
      }
      if (local_28 + 7 < in_RDX) {
        in_stack_fffffffffffffd90 = (uint)*(byte *)(in_RSI + 7 + local_28);
      }
      else {
        in_stack_fffffffffffffd90 = 0;
      }
      *(uint *)(pcVar10 + 8) =
           local_258 | local_260 << 8 | (local_268 | in_stack_fffffffffffffd90 << 8) << 0x10;
      if (local_28 + 8 < in_RDX) {
        in_stack_fffffffffffffd88 = (uint)*(byte *)(in_RSI + 8 + local_28);
      }
      else {
        in_stack_fffffffffffffd88 = 0;
      }
      if (local_28 + 9 < in_RDX) {
        in_stack_fffffffffffffd84 = (uint)*(byte *)(in_RSI + 9 + local_28);
      }
      else {
        in_stack_fffffffffffffd84 = 0;
      }
      in_stack_fffffffffffffd80 = in_stack_fffffffffffffd88 | in_stack_fffffffffffffd84 << 8;
      if (local_28 + 10 < in_RDX) {
        in_stack_fffffffffffffd78 = (uint)*(byte *)(in_RSI + 10 + local_28);
      }
      else {
        in_stack_fffffffffffffd78 = 0;
      }
      if (local_28 + 0xb < in_RDX) {
        in_stack_fffffffffffffd74 = (uint)*(byte *)(in_RSI + 0xb + local_28);
      }
      else {
        in_stack_fffffffffffffd74 = 0;
      }
      *(uint *)(pcVar10 + 0xc) =
           in_stack_fffffffffffffd80 |
           (in_stack_fffffffffffffd78 | in_stack_fffffffffffffd74 << 8) << 0x10;
      *(int *)(pcVar10 + 0x10) = *(int *)(pcVar10 + 8) + *(int *)(pcVar10 + 0xc);
      if (local_28 + 0xc < in_RDX) {
        in_stack_fffffffffffffd70 = (uint)*(byte *)(in_RSI + 0xc + local_28);
      }
      else {
        in_stack_fffffffffffffd70 = 0;
      }
      *(float *)(pcVar10 + 0x14) = (float)in_stack_fffffffffffffd70 / 64.0;
      if (local_28 + 0xd < in_RDX) {
        cVar4 = *(char *)(in_RSI + 0xd + local_28);
      }
      else {
        cVar4 = '\0';
      }
      pcVar10[0x18] = cVar4;
      if (*(uint *)(pcVar10 + 4) < *(uint *)(pcVar10 + 8)) {
        *(undefined4 *)(pcVar10 + 8) = *(undefined4 *)(pcVar10 + 4);
      }
      if (*(uint *)(pcVar10 + 4) < *(uint *)(pcVar10 + 0x10)) {
        *(undefined4 *)(pcVar10 + 0x10) = *(undefined4 *)(pcVar10 + 4);
      }
      *(int *)(pcVar10 + 0xc) = *(int *)(pcVar10 + 0x10) - *(int *)(pcVar10 + 8);
      if (local_28 + 0xe < in_RDX) {
        bVar1 = *(byte *)(in_RSI + 0xe + local_28);
      }
      else {
        bVar1 = 0;
      }
      if (((bVar1 & 3) == 0) || (*(int *)(pcVar10 + 0xc) == 0)) {
        pcVar10[0x1c] = '\0';
        pcVar10[0x1d] = '\0';
        pcVar10[0x1e] = '\0';
        pcVar10[0x1f] = '\0';
      }
      else if ((bVar1 & 3) == 1) {
        pcVar10[0x1c] = '\x01';
        pcVar10[0x1d] = '\0';
        pcVar10[0x1e] = '\0';
        pcVar10[0x1f] = '\0';
      }
      else {
        pcVar10[0x1c] = '\x02';
        pcVar10[0x1d] = '\0';
        pcVar10[0x1e] = '\0';
        pcVar10[0x1f] = '\0';
      }
      cVar4 = '\b';
      if ((bVar1 & 0x10) != 0) {
        cVar4 = '\x10';
      }
      *pcVar10 = cVar4;
      if (local_28 + 0xf < in_RDX) {
        bVar1 = *(byte *)(in_RSI + 0xf + local_28);
      }
      else {
        bVar1 = 0;
      }
      *(float *)(pcVar10 + 0x20) = (float)bVar1 / 255.0;
      if (local_28 + 0x10 < in_RDX) {
        cVar4 = *(char *)(in_RSI + 0x10 + local_28);
      }
      else {
        cVar4 = '\0';
      }
      pcVar10[0x24] = cVar4;
      *(char **)(pcVar10 + 0x30) = local_20;
      local_20 = local_20 + *(uint *)(pcVar10 + 4);
      if (*pcVar10 == '\x10') {
        *(uint *)(pcVar10 + 8) = *(uint *)(pcVar10 + 8) >> 1;
        *(uint *)(pcVar10 + 0xc) = *(uint *)(pcVar10 + 0xc) >> 1;
        *(uint *)(pcVar10 + 0x10) = *(uint *)(pcVar10 + 0x10) >> 1;
        *(uint *)(pcVar10 + 4) = *(uint *)(pcVar10 + 4) >> 1;
      }
      local_28 = local_28 + 0x28;
      in_stack_fffffffffffffd7c = in_stack_fffffffffffffd78;
      in_stack_fffffffffffffd8c = in_stack_fffffffffffffd88;
    }
    for (local_84 = 0; local_84 < *puVar8; local_84 = local_84 + 1) {
      pcVar10 = (char *)(*(long *)(puVar8 + 0x78) + (long)(int)(uint)local_84 * 0x38);
      uVar6 = *(uint *)(pcVar10 + 4);
      if (*pcVar10 == '\x10') {
        local_96 = 0;
        for (local_9c = 0; local_9c < uVar6; local_9c = local_9c + 1) {
          if (local_28 + (local_9c << 1) < in_RDX) {
            local_2a8 = (ushort)*(byte *)(in_RSI + local_28 + (local_9c << 1));
          }
          else {
            local_2a8 = 0;
          }
          if (local_28 + (local_9c << 1) + 1 < in_RDX) {
            uVar5 = (ushort)*(byte *)(in_RSI + 1 + local_28 + (local_9c << 1));
          }
          else {
            uVar5 = 0;
          }
          local_96 = local_96 + (local_2a8 | uVar5 << 8);
          *(short *)(*(long *)(pcVar10 + 0x30) + (ulong)local_9c * 2) = local_96;
        }
        uVar6 = *(int *)(pcVar10 + 4) << 1;
      }
      else {
        local_9d = '\0';
        for (local_a4 = 0; local_a4 < uVar6; local_a4 = local_a4 + 1) {
          if (local_28 + local_a4 < in_RDX) {
            cVar4 = *(char *)(in_RSI + local_28 + local_a4);
          }
          else {
            cVar4 = '\0';
          }
          local_9d = local_9d + cVar4;
          *(char *)(*(long *)(pcVar10 + 0x30) + (ulong)local_a4) = local_9d;
        }
        uVar6 = *(uint *)(pcVar10 + 4);
      }
      local_28 = uVar6 + local_28;
    }
  }
  return local_20;
}

Assistant:

char* xm_load_module(xm_context_t* ctx, const char* moddata, size_t moddata_length, char* mempool) {
	size_t offset = 0;
	xm_module_t* mod = &(ctx->module);

	/* Read XM header */
#if XM_STRINGS
	READ_MEMCPY(mod->name, offset + 17, MODULE_NAME_LENGTH);
	READ_MEMCPY(mod->trackername, offset + 38, TRACKER_NAME_LENGTH);
#endif
	offset += 60;

	/* Read module header */
	uint32_t header_size = READ_U32(offset);

	mod->length = READ_U16(offset + 4);
	mod->restart_position = READ_U16(offset + 6);
	mod->num_channels = READ_U16(offset + 8);
	mod->num_patterns = READ_U16(offset + 10);
	mod->num_instruments = READ_U16(offset + 12);

	mod->patterns = (xm_pattern_t*)mempool;
	mempool += mod->num_patterns * sizeof(xm_pattern_t);

	mod->instruments = (xm_instrument_t*)mempool;
	mempool += mod->num_instruments * sizeof(xm_instrument_t);

	uint16_t flags = READ_U32(offset + 14);
	mod->frequency_type = (flags & (1 << 0)) ? XM_LINEAR_FREQUENCIES : XM_AMIGA_FREQUENCIES;

	ctx->tempo = READ_U16(offset + 16);
	ctx->bpm = READ_U16(offset + 18);

	READ_MEMCPY(mod->pattern_table, offset + 20, PATTERN_ORDER_TABLE_LENGTH);
	offset += header_size;

	/* Read patterns */
	for(uint16_t i = 0; i < mod->num_patterns; ++i) {
		uint16_t packed_patterndata_size = READ_U16(offset + 7);
		xm_pattern_t* pat = mod->patterns + i;

		pat->num_rows = READ_U16(offset + 5);

		pat->slots = (xm_pattern_slot_t*)mempool;
		mempool += mod->num_channels * pat->num_rows * sizeof(xm_pattern_slot_t);

		/* Pattern header length */
		offset += READ_U32(offset);

		if(packed_patterndata_size == 0) {
			/* No pattern data is present */
			memset(pat->slots, 0, sizeof(xm_pattern_slot_t) * pat->num_rows * mod->num_channels);
		} else {
			/* This isn't your typical for loop */
			for(uint16_t j = 0, k = 0; j < packed_patterndata_size; ++k) {
				uint8_t note = READ_U8(offset + j);
				xm_pattern_slot_t* slot = pat->slots + k;

				if(note & (1 << 7)) {
					/* MSB is set, this is a compressed packet */
					++j;

					if(note & (1 << 0)) {
						/* Note follows */
						slot->note = READ_U8(offset + j);
						++j;
					} else {
						slot->note = 0;
					}

					if(note & (1 << 1)) {
						/* Instrument follows */
						slot->instrument = READ_U8(offset + j);
						++j;
					} else {
						slot->instrument = 0;
					}

					if(note & (1 << 2)) {
						/* Volume column follows */
						slot->volume_column = READ_U8(offset + j);
						++j;
					} else {
						slot->volume_column = 0;
					}

					if(note & (1 << 3)) {
						/* Effect follows */
						slot->effect_type = READ_U8(offset + j);
						++j;
					} else {
						slot->effect_type = 0;
					}

					if(note & (1 << 4)) {
						/* Effect parameter follows */
						slot->effect_param = READ_U8(offset + j);
						++j;
					} else {
						slot->effect_param = 0;
					}
				} else {
					/* Uncompressed packet */
					slot->note = note;
					slot->instrument = READ_U8(offset + j + 1);
					slot->volume_column = READ_U8(offset + j + 2);
					slot->effect_type = READ_U8(offset + j + 3);
					slot->effect_param = READ_U8(offset + j + 4);
					j += 5;
				}
			}
		}

		offset += packed_patterndata_size;
	}

	/* Read instruments */
	for(uint16_t i = 0; i < ctx->module.num_instruments; ++i) {
		xm_instrument_t* instr = mod->instruments + i;

		/* Original FT2 would load instruments with a direct read into the
		   instrument data structure that was previously zeroed. This means
		   that if the declared length was less than INSTRUMENT_HEADER_LENGTH,
		   all excess data would be zeroed. This is used by the XM compressor
		   BoobieSqueezer. To implement this, bound all reads to the header size. */
		uint32_t ins_header_size = READ_U32(offset);
		if (ins_header_size == 0 || ins_header_size > INSTRUMENT_HEADER_LENGTH)
			ins_header_size = INSTRUMENT_HEADER_LENGTH;

#if XM_STRINGS
		READ_MEMCPY_BOUND(instr->name, offset + 4, INSTRUMENT_NAME_LENGTH, offset + ins_header_size);
		instr->name[INSTRUMENT_NAME_LENGTH] = 0;
#endif
	    instr->num_samples = READ_U16_BOUND(offset + 27, offset + ins_header_size);

		if(instr->num_samples > 0) {
			/* Read extra header properties */
			READ_MEMCPY_BOUND(instr->sample_of_notes, offset + 33, NUM_NOTES, offset + ins_header_size);

			instr->volume_envelope.num_points = READ_U8_BOUND(offset + 225, offset + ins_header_size);
			if (instr->volume_envelope.num_points > NUM_ENVELOPE_POINTS)
				instr->volume_envelope.num_points = NUM_ENVELOPE_POINTS;

			instr->panning_envelope.num_points = READ_U8_BOUND(offset + 226, offset + ins_header_size);
			if (instr->panning_envelope.num_points > NUM_ENVELOPE_POINTS)
				instr->panning_envelope.num_points = NUM_ENVELOPE_POINTS;

			for(uint8_t j = 0; j < instr->volume_envelope.num_points; ++j) {
				instr->volume_envelope.points[j].frame = READ_U16_BOUND(offset + 129 + 4 * j, offset + ins_header_size);
				instr->volume_envelope.points[j].value = READ_U16_BOUND(offset + 129 + 4 * j + 2, offset + ins_header_size);
			}

			for(uint8_t j = 0; j < instr->panning_envelope.num_points; ++j) {
				instr->panning_envelope.points[j].frame = READ_U16_BOUND(offset + 177 + 4 * j, offset + ins_header_size);
				instr->panning_envelope.points[j].value = READ_U16_BOUND(offset + 177 + 4 * j + 2, offset + ins_header_size);
			}

			instr->volume_envelope.sustain_point = READ_U8_BOUND(offset + 227, offset + ins_header_size);
			instr->volume_envelope.loop_start_point = READ_U8_BOUND(offset + 228, offset + ins_header_size);
			instr->volume_envelope.loop_end_point = READ_U8_BOUND(offset + 229, offset + ins_header_size);

			instr->panning_envelope.sustain_point = READ_U8_BOUND(offset + 230, offset + ins_header_size);
			instr->panning_envelope.loop_start_point = READ_U8_BOUND(offset + 231, offset + ins_header_size);
			instr->panning_envelope.loop_end_point = READ_U8_BOUND(offset + 232, offset + ins_header_size);

			// Fix broken modules with loop points outside of defined points
			if (instr->volume_envelope.num_points > 0) {
				instr->volume_envelope.loop_start_point =
					MIN(instr->volume_envelope.loop_start_point, instr->volume_envelope.num_points-1);
				instr->volume_envelope.loop_end_point =
					MIN(instr->volume_envelope.loop_end_point,   instr->volume_envelope.num_points-1);
			}
			if (instr->panning_envelope.num_points > 0) {
				instr->panning_envelope.loop_start_point =
					MIN(instr->panning_envelope.loop_start_point, instr->panning_envelope.num_points-1);
				instr->panning_envelope.loop_end_point =
					MIN(instr->panning_envelope.loop_end_point,   instr->panning_envelope.num_points-1);
			}

			uint8_t flags = READ_U8_BOUND(offset + 233, offset + ins_header_size);
			instr->volume_envelope.enabled = flags & (1 << 0);
			instr->volume_envelope.sustain_enabled = flags & (1 << 1);
			instr->volume_envelope.loop_enabled = flags & (1 << 2);

			flags = READ_U8_BOUND(offset + 234, offset + ins_header_size);
			instr->panning_envelope.enabled = flags & (1 << 0);
			instr->panning_envelope.sustain_enabled = flags & (1 << 1);
			instr->panning_envelope.loop_enabled = flags & (1 << 2);

			instr->vibrato_type = READ_U8_BOUND(offset + 235, offset + ins_header_size);
			if(instr->vibrato_type == 2) {
				instr->vibrato_type = 1;
			} else if(instr->vibrato_type == 1) {
				instr->vibrato_type = 2;
			}
			instr->vibrato_sweep = READ_U8_BOUND(offset + 236, offset + ins_header_size);
			instr->vibrato_depth = READ_U8_BOUND(offset + 237, offset + ins_header_size);
			instr->vibrato_rate = READ_U8_BOUND(offset + 238, offset + ins_header_size);
			instr->volume_fadeout = READ_U16_BOUND(offset + 239, offset + ins_header_size);

			instr->samples = (xm_sample_t*)mempool;
			mempool += instr->num_samples * sizeof(xm_sample_t);
		} else {
			instr->samples = NULL;
		}

		/* Instrument header size */
		offset += ins_header_size;

		for(uint16_t j = 0; j < instr->num_samples; ++j) {
			/* Read sample header */
			xm_sample_t* sample = instr->samples + j;

			sample->length = READ_U32(offset);
			sample->loop_start = READ_U32(offset + 4);
			sample->loop_length = READ_U32(offset + 8);
			sample->loop_end = sample->loop_start + sample->loop_length;
			sample->volume = (float)READ_U8(offset + 12) / (float)0x40;
			sample->finetune = (int8_t)READ_U8(offset + 13);

			/* Fix invalid loop definitions */
			if (sample->loop_start > sample->length)
				sample->loop_start = sample->length;
			if (sample->loop_end > sample->length)
				sample->loop_end = sample->length;
			sample->loop_length = sample->loop_end - sample->loop_start;

			uint8_t flags = READ_U8(offset + 14);
			if((flags & 3) == 0 || sample->loop_length == 0) {
				sample->loop_type = XM_NO_LOOP;
			} else if((flags & 3) == 1) {
				sample->loop_type = XM_FORWARD_LOOP;
			} else {
				sample->loop_type = XM_PING_PONG_LOOP;
			}

			sample->bits = (flags & (1 << 4)) ? 16 : 8;

			sample->panning = (float)READ_U8(offset + 15) / (float)0xFF;
			sample->relative_note = (int8_t)READ_U8(offset + 16);
#if XM_STRINGS
			READ_MEMCPY(sample->name, offset + 18, SAMPLE_NAME_LENGTH);
			sample->name[SAMPLE_NAME_LENGTH] = 0;
#endif
			sample->data8 = (int8_t*)mempool;
			mempool += sample->length;

			if(sample->bits == 16) {
				sample->loop_start >>= 1;
				sample->loop_length >>= 1;
				sample->loop_end >>= 1;
				sample->length >>= 1;
			}

			/* Notice that, even if there's a "sample header size" in the
			   instrument header, that value seems ignored, and might even
			   be wrong in some corrupted modules. */
			offset += 40;
		}

		for(uint16_t j = 0; j < instr->num_samples; ++j) {
			/* Read sample data */
			xm_sample_t* sample = instr->samples + j;
			uint32_t length = sample->length;

			if(sample->bits == 16) {
				int16_t v = 0;
				for(uint32_t k = 0; k < length; ++k) {
					v = v + (int16_t)READ_U16(offset + (k << 1));
					sample->data16[k] = v;
				}
				offset += sample->length << 1;
			} else {
				int8_t v = 0;
				for(uint32_t k = 0; k < length; ++k) {
					v = v + (int8_t)READ_U8(offset + k);
					sample->data8[k] = v;
				}
				offset += sample->length;
			}
		}
	}

	return mempool;
}